

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,char **arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_6)

{
  string_view data;
  string_view format_00;
  string local_1a0;
  Arg local_180;
  Arg local_150;
  Arg local_120;
  Arg local_f0;
  Arg local_c0;
  Arg local_90;
  size_type local_60;
  pointer local_58;
  
  format_00._M_len = format._M_str;
  local_58 = (arg->_M_dataplus)._M_p;
  local_60 = arg->_M_string_length;
  local_90.piece_._M_str = (arg_1->_M_dataplus)._M_p;
  local_90.piece_._M_len = arg_1->_M_string_length;
  local_c0.piece_ = absl::lts_20250127::NullSafeStringView(*arg_2);
  local_f0.piece_._M_str = (arg_3->_M_dataplus)._M_p;
  local_f0.piece_._M_len = arg_3->_M_string_length;
  local_120.piece_._M_str = (arg_4->_M_dataplus)._M_p;
  local_120.piece_._M_len = arg_4->_M_string_length;
  local_150.piece_._M_str = (arg_5->_M_dataplus)._M_p;
  local_150.piece_._M_len = arg_5->_M_string_length;
  local_180.piece_._M_str = (arg_6->_M_dataplus)._M_p;
  local_180.piece_._M_len = arg_6->_M_string_length;
  format_00._M_str = (char *)&local_60;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_1a0,(lts_20250127 *)format._M_len,format_00,&local_90,&local_c0,&local_f0,
             &local_120,&local_150,&local_180,(Arg *)this);
  data._M_str = local_1a0._M_dataplus._M_p;
  data._M_len = local_1a0._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_1a0);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }